

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

int sys_trim(mstate m,size_t pad)

{
  mchunkptr pmVar1;
  char *__addr;
  int iVar2;
  msegmentptr sp;
  long lVar3;
  size_t sVar4;
  malloc_segment *pmVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  malloc_segment *pmVar9;
  ulong __len;
  bool bVar10;
  bool bVar11;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (0xffffffffffffff7f < pad) {
    return 0;
  }
  pmVar1 = m->top;
  if (pmVar1 == (mchunkptr)0x0) {
    return 0;
  }
  if (m->topsize <= pad + 0x50) {
    __len = 0;
    goto LAB_001308d5;
  }
  __len = (((m->topsize - pad) + -0x51 + mparams.granularity) / mparams.granularity - 1) *
          mparams.granularity;
  pmVar5 = &m->seg;
  pmVar9 = pmVar5;
  do {
    if (((mchunkptr)pmVar9->base <= pmVar1) &&
       (pmVar1 < (mchunkptr)((long)&((mchunkptr)pmVar9->base)->prev_foot + pmVar9->size)))
    goto LAB_0013085a;
    pmVar9 = pmVar9->next;
  } while (pmVar9 != (malloc_segment *)0x0);
  pmVar9 = (malloc_segment *)0x0;
LAB_0013085a:
  if ((pmVar9->sflags & 9) == 1) {
    uVar7 = pmVar9->size;
    if (uVar7 < __len) goto LAB_00130878;
    __addr = pmVar9->base;
    do {
      bVar10 = __addr <= pmVar5;
      bVar11 = pmVar5 < __addr + uVar7;
      if (bVar11 && bVar10) goto LAB_00130878;
      pmVar5 = pmVar5->next;
    } while (pmVar5 != (malloc_segment *)0x0);
    if ((bVar11 && bVar10) ||
       ((pvVar6 = mremap(__addr,uVar7,uVar7 - __len,0), pvVar6 == (void *)0xffffffffffffffff &&
        (iVar2 = munmap(pmVar9->base + (uVar7 - __len),__len), iVar2 != 0)))) goto LAB_00130878;
  }
  else {
LAB_00130878:
    __len = 0;
  }
  if (__len != 0) {
    pmVar9->size = pmVar9->size - __len;
    m->footprint = m->footprint - __len;
    pmVar1 = m->top;
    lVar3 = m->topsize - __len;
    uVar7 = (ulong)(-(int)pmVar1 - 0x10U & 0xf);
    uVar8 = lVar3 - uVar7;
    m->top = (mchunkptr)((long)&pmVar1->prev_foot + uVar7);
    m->topsize = uVar8;
    *(ulong *)((long)&pmVar1->head + uVar7) = uVar8 | 1;
    *(undefined8 *)((long)pmVar1 + lVar3 + 8) = 0x50;
    m->trim_check = mparams.trim_threshold;
  }
LAB_001308d5:
  sVar4 = release_unused_segments(m);
  iVar2 = 1;
  if ((sVar4 + __len == 0) && (iVar2 = 0, m->trim_check < m->topsize)) {
    m->trim_check = 0xffffffffffffffff;
  }
  return iVar2;
}

Assistant:

static int sys_trim(mstate m, size_t pad) {
  size_t released = 0;
  ensure_initialization();
  if (pad < MAX_REQUEST && is_initialized(m)) {
    pad += TOP_FOOT_SIZE; /* ensure enough room for segment overhead */

    if (m->topsize > pad) {
      /* Shrink top space in granularity-size units, keeping at least one */
      size_t unit = mparams.granularity;
      size_t extra = ((m->topsize - pad + (unit - SIZE_T_ONE)) / unit -
                      SIZE_T_ONE) * unit;
      msegmentptr sp = segment_holding(m, (char*)m->top);

      if (!is_extern_segment(sp)) {
        if (is_mmapped_segment(sp)) {
          if (HAVE_MMAP &&
              sp->size >= extra &&
              !has_segment_link(m, sp)) { /* can't shrink if pinned */
            size_t newsize = sp->size - extra;
            (void)newsize; /* placate people compiling -Wunused-variable */
            /* Prefer mremap, fall back to munmap */
            if ((CALL_MREMAP(sp->base, sp->size, newsize, 0) != MFAIL) ||
                (CALL_MUNMAP(sp->base + newsize, extra) == 0)) {
              released = extra;
            }
          }
        }
        else if (HAVE_MORECORE) {
          if (extra >= HALF_MAX_SIZE_T) /* Avoid wrapping negative */
            extra = (HALF_MAX_SIZE_T) + SIZE_T_ONE - unit;
          ACQUIRE_MALLOC_GLOBAL_LOCK();
          {
            /* Make sure end of memory is where we last set it. */
            char* old_br = (char*)(CALL_MORECORE(0));
            if (old_br == sp->base + sp->size) {
              char* rel_br = (char*)(CALL_MORECORE(-extra));
              char* new_br = (char*)(CALL_MORECORE(0));
              if (rel_br != CMFAIL && new_br < old_br)
                released = old_br - new_br;
            }
          }
          RELEASE_MALLOC_GLOBAL_LOCK();
        }
      }

      if (released != 0) {
        sp->size -= released;
        m->footprint -= released;
        init_top(m, m->top, m->topsize - released);
        check_top_chunk(m, m->top);
      }
    }

    /* Unmap any unused mmapped segments */
    if (HAVE_MMAP)
      released += release_unused_segments(m);

    /* On failure, disable autotrim to avoid repeated failed future calls */
    if (released == 0 && m->topsize > m->trim_check)
      m->trim_check = MAX_SIZE_T;
  }

  return (released != 0)? 1 : 0;
}